

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::clear
          (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RDI;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  if (lVar1 != 0) {
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar3 = lVar1 + lVar2 * 0x90; lVar1 != lVar3; lVar3 = lVar3 + -0x90) {
      Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::~Span
                ((Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *)0x32f83c);
    }
    operator_delete__((void *)(lVar1 + -8),lVar2 * 0x90 + 8);
  }
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void clear()
    {
        delete[] spans;
        spans = nullptr;
        size = 0;
        numBuckets = 0;
    }